

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O0

void __thiscall xLearn::Checker::check_conflict_predict(Checker *this,HyperParam *hyper_param)

{
  long in_RSI;
  string *out;
  undefined1 local_31 [33];
  long local_10;
  
  if (((*(byte *)(in_RSI + 0x1fc) & 1) != 0) && ((*(byte *)(in_RSI + 0x1fd) & 1) != 0)) {
    out = (string *)local_31;
    local_10 = in_RSI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_31 + 1),
               "Both of --sign and --sigmoid have been set. xLearn has already disable --sign and --sigmoid."
               ,(allocator *)out);
    Color::print_warning(out);
    std::__cxx11::string::~string((string *)(local_31 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_31);
    *(undefined1 *)(local_10 + 0x1fc) = 0;
    *(undefined1 *)(local_10 + 0x1fd) = 0;
  }
  return;
}

Assistant:

void Checker::check_conflict_predict(HyperParam& hyper_param) {
  if (hyper_param.sign && hyper_param.sigmoid) {
    Color::print_warning("Both of --sign and --sigmoid have been set. "
                         "xLearn has already disable --sign and --sigmoid.");
    hyper_param.sign = false;
    hyper_param.sigmoid = false;
  }
}